

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::SequenceFeatureType::ByteSizeLong(SequenceFeatureType *this)

{
  size_t sVar1;
  
  if (this->sizerange_ == (SizeRange *)0x0 ||
      this == (SequenceFeatureType *)&_SequenceFeatureType_default_instance_) {
    sVar1 = 0;
  }
  else {
    sVar1 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::SizeRange>(this->sizerange_);
    sVar1 = sVar1 + 2;
  }
  if ((this->_oneof_case_[0] | 2) == 3) {
    ((this->Type_).int64type_)->_cached_size_ = 0;
    sVar1 = sVar1 + 2;
  }
  this->_cached_size_ = (int)sVar1;
  return sVar1;
}

Assistant:

size_t SequenceFeatureType::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.SequenceFeatureType)
  size_t total_size = 0;

  // .CoreML.Specification.SizeRange sizeRange = 101;
  if (this->has_sizerange()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->sizerange_);
  }

  switch (Type_case()) {
    // .CoreML.Specification.Int64FeatureType int64Type = 1;
    case kInt64Type: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.int64type_);
      break;
    }
    // .CoreML.Specification.StringFeatureType stringType = 3;
    case kStringType: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.stringtype_);
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}